

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

XFontStruct * __thiscall Am_Font_Data::Get_X_Font(Am_Font_Data *this,Am_Drawonable_Impl *d)

{
  bool bVar1;
  char *font_name_00;
  int local_4c;
  char *font_name;
  XFontStruct *font_info;
  XFontStruct *xfont;
  Display *disp;
  Am_Drawonable_Impl *d_local;
  Am_Font_Data *this_local;
  
  disp = (Display *)d;
  d_local = (Am_Drawonable_Impl *)this;
  xfont = (XFontStruct *)Am_Drawonable_Impl::Get_Display(d);
  if (xfont == (XFontStruct *)this->main_display) {
    this_local = (Am_Font_Data *)this->main_xfont;
  }
  else {
    bVar1 = Get_Font(this,(Display *)xfont,&font_info);
    if (bVar1) {
      this_local = (Am_Font_Data *)font_info;
    }
    else {
      font_name_00 = Get_Font_Name(this);
      if (font_name_00 == (char *)0x0) {
        initialize_standard_font
                  ((Display *)xfont,*(int *)(*(long *)(disp + 0x70) + 0x20),this,
                   (XFontStruct **)&font_name);
      }
      else {
        initialize_font_from_file
                  ((Display *)xfont,*(int *)(*(long *)(disp + 0x70) + 0x20),font_name_00,
                   (XFontStruct **)&font_name);
      }
      if (this->main_display == (Display *)0x0) {
        this->main_display = (Display *)xfont;
        this->main_xfont = (XFontStruct *)font_name;
        if (*(short *)(font_name + 0x3c) == *(short *)(font_name + 0x48)) {
          local_4c = (int)*(short *)(font_name + 0x3c);
        }
        else {
          local_4c = 0;
        }
        this->char_width = local_4c;
      }
      else {
        Add_Font(this,(Display *)xfont,(XFontStruct *)font_name);
      }
      this_local = (Am_Font_Data *)font_name;
    }
  }
  return (XFontStruct *)this_local;
}

Assistant:

XFontStruct *
Am_Font_Data::Get_X_Font(const Am_Drawonable_Impl *d)
{
  Display *disp = d->Get_Display();
  XFontStruct *xfont;
  if (disp == main_display)
    return main_xfont;
  else if (Get_Font(disp, xfont))
    return xfont;
  else {
    XFontStruct *font_info;
    const char *font_name = Get_Font_Name();
    if (font_name == nullptr)
      initialize_standard_font(disp, d->screen->screen_number, this,
                               &font_info);
    else
      initialize_font_from_file(disp, d->screen->screen_number, font_name,
                                &font_info);

    if (main_display)
      Add_Font(disp, font_info);
    else {
      main_display = disp;
      main_xfont = font_info;
      // set char_width for fixed width fonts, on main display only
      char_width = (font_info->min_bounds.width == font_info->max_bounds.width)
                       ? font_info->min_bounds.width
                       : 0;
    }

    return font_info;
  }
}